

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall
FxRuntimeStateIndex::Resolve(FxRuntimeStateIndex *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FxRuntimeStateIndex *this_00;
  FxStateByIndex *this_01;
  undefined4 extraout_var_00;
  FxIntCast *this_02;
  undefined4 extraout_var_01;
  PClassActor *pPVar4;
  FxExpression *size;
  size_t size_00;
  PClassActor *aclass;
  FxStateByIndex *x_1;
  FxConstant *x;
  int symlabel;
  ExpVal local_38;
  int local_24;
  PType *pPStack_20;
  int index;
  FCompileContext *ctx_local;
  FxRuntimeStateIndex *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    pPStack_20 = (PType *)ctx;
    ctx_local = (FCompileContext *)this;
    if (this->Index != (FxExpression *)0x0) {
      iVar2 = (*this->Index->_vptr_FxExpression[2])();
      this->Index = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->Index == (FxExpression *)0x0) {
      if (this != (FxRuntimeStateIndex *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxRuntimeStateIndex *)0x0;
    }
    else {
      bVar1 = FxExpression::IsNumeric(this->Index);
      if (bVar1) {
        uVar3 = (*this->Index->_vptr_FxExpression[3])();
        if ((uVar3 & 1) == 0) {
          iVar2 = PType::GetRegType(this->Index->ValueType);
          if (iVar2 != 0) {
            this_02 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
            FxIntCast::FxIntCast
                      (this_02,this->Index,(bool)(*(bool *)&pPStack_20->HashNext & 1),false);
            this->Index = (FxExpression *)this_02;
            if (this->Index != (FxExpression *)0x0) {
              iVar2 = (*this->Index->_vptr_FxExpression[2])(this->Index,pPStack_20);
              this->Index = (FxExpression *)CONCAT44(extraout_var_01,iVar2);
            }
            if (this->Index == (FxExpression *)0x0) {
              if (this != (FxRuntimeStateIndex *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              return (FxExpression *)0x0;
            }
          }
          pPVar4 = dyn_cast<PClassActor>((DObject *)*(PStruct **)&pPStack_20->Align);
          bVar1 = false;
          if (pPVar4 != (PClassActor *)0x0) {
            bVar1 = 0 < pPVar4->NumOwnedStates;
          }
          if (!bVar1) {
            __assert_fail("aclass != nullptr && aclass->NumOwnedStates > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0x2640,
                          "virtual FxExpression *FxRuntimeStateIndex::Resolve(FCompileContext &)");
          }
          iVar2 = FStateLabelStorage::AddPointer
                            (&StateLabels,
                             pPVar4->OwnedStates + *(int *)((long)&pPStack_20->HashNext + 4));
          this->symlabel = iVar2;
          (this->super_FxExpression).ValueType = (PType *)TypeStateLabel;
          this_local = this;
        }
        else {
          size = this->Index;
          FxConstant::GetValue((FxConstant *)&local_38);
          iVar2 = ExpVal::GetInt(&local_38);
          ExpVal::~ExpVal(&local_38);
          local_24 = iVar2;
          if ((iVar2 < 0) || ((iVar2 == 0 && (((ulong)pPStack_20->HashNext & 1) == 0)))) {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,"State index must be positive");
            if (this != (FxRuntimeStateIndex *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            this_local = (FxRuntimeStateIndex *)0x0;
          }
          else if (iVar2 == 0) {
            size_00 = 0;
            iVar2 = FStateLabelStorage::AddPointer(&StateLabels,(FState *)0x0);
            this_00 = (FxRuntimeStateIndex *)
                      FxExpression::operator_new((FxExpression *)0x38,size_00);
            FxConstant::FxConstant
                      ((FxConstant *)this_00,iVar2,&(this->super_FxExpression).ScriptPosition);
            if (this != (FxRuntimeStateIndex *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            (this_00->super_FxExpression).ValueType = (PType *)TypeStateLabel;
            this_local = this_00;
          }
          else {
            this_01 = (FxStateByIndex *)
                      FxExpression::operator_new((FxExpression *)0x30,(size_t)size);
            FxStateByIndex::FxStateByIndex
                      (this_01,*(int *)((long)&pPStack_20->HashNext + 4) + local_24,
                       &(this->super_FxExpression).ScriptPosition);
            if (this != (FxRuntimeStateIndex *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            iVar2 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,pPStack_20);
            this_local = (FxRuntimeStateIndex *)CONCAT44(extraout_var_00,iVar2);
          }
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
        if (this != (FxRuntimeStateIndex *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxRuntimeStateIndex *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxRuntimeStateIndex::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Index, ctx);

	if (!Index->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return nullptr;
	}
	else if (Index->isConstant())
	{
		int index = static_cast<FxConstant *>(Index)->GetValue().GetInt();
		if (index < 0 || (index == 0 && !ctx.FromDecorate))
		{
			ScriptPosition.Message(MSG_ERROR, "State index must be positive");
			delete this;
			return nullptr;
		}
		else if (index == 0)
		{
			int symlabel = StateLabels.AddPointer(nullptr);
			auto x = new FxConstant(symlabel, ScriptPosition);
			delete this;
			x->ValueType = TypeStateLabel;
			return x;
		}
		else
		{
			auto x = new FxStateByIndex(ctx.StateIndex + index, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}
	else if (Index->ValueType->GetRegType() != REGT_INT)
	{ // Float.
		Index = new FxIntCast(Index, ctx.FromDecorate);
		SAFE_RESOLVE(Index, ctx);
	}
	auto aclass = dyn_cast<PClassActor>(ctx.Class);
	assert(aclass != nullptr && aclass->NumOwnedStates > 0);
	symlabel = StateLabels.AddPointer(aclass->OwnedStates + ctx.StateIndex);
	ValueType = TypeStateLabel;
	return this;
}